

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void timer_read(void *context,cio_epoll_error error)

{
  code *pcVar1;
  ssize_t sVar2;
  uint64_t number_of_expirations;
  undefined8 local_10;
  
  if (error == CIO_EPOLL_SUCCESS) {
    local_10 = 0;
    sVar2 = read(*(int *)((long)context + 0x30),&local_10,8);
    if (sVar2 == -1) {
      timer_read_cold_2();
    }
    else {
      pcVar1 = *(code **)((long)context + 8);
      *(undefined8 *)((long)context + 8) = 0;
      (*pcVar1)(context,*(undefined8 *)((long)context + 0x10),0);
    }
  }
  else {
    timer_read_cold_1();
  }
  return;
}

Assistant:

static void timer_read(void *context, enum cio_epoll_error error)
{
	struct cio_timer *timer = context;

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		cio_timer_handler_t handler = timer->handler;
		timer->handler = NULL;
		enum cio_error err = cio_linux_get_socket_error(timer->impl.ev.fd);
		handler(timer, timer->handler_context, err);
		return;
	}

	uint64_t number_of_expirations = 0;

	ssize_t ret = read(timer->impl.ev.fd, &number_of_expirations, sizeof(number_of_expirations));
	if (cio_unlikely(ret == -1)) {
		if (cio_unlikely(errno != EAGAIN)) {
			timer->handler(timer, timer->handler_context, (enum cio_error)(-errno));
		}
	} else {
		cio_timer_handler_t handler = timer->handler;
		timer->handler = NULL;
		handler(timer, timer->handler_context, CIO_SUCCESS);
	}
}